

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O0

void __thiscall
Reset_resetRemoveTestValue_Test::Reset_resetRemoveTestValue_Test
          (Reset_resetRemoveTestValue_Test *this)

{
  Reset_resetRemoveTestValue_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Reset_resetRemoveTestValue_Test_00127440;
  return;
}

Assistant:

TEST(Reset, resetRemoveTestValue)
{
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_EQ("", r->testValue());

    r->setTestValue("some test condition math");

    EXPECT_EQ("some test condition math", r->testValue());

    r->removeTestValue();

    EXPECT_EQ("", r->testValue());
}